

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O1

bool __thiscall slang::syntax::SyntaxNode::isEquivalentTo(SyntaxNode *this,SyntaxNode *other)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  SyntaxNode *this_00;
  SyntaxNode *other_00;
  size_t __n;
  size_type __rlen;
  bool bVar5;
  string_view sVar6;
  string_view sVar7;
  Token lt;
  Token rt;
  Token local_58;
  size_t local_48;
  Token local_40;
  
  sVar3 = getChildCount(this);
  if ((this->kind == other->kind) && (sVar4 = getChildCount(other), sVar3 == sVar4)) {
    bVar5 = sVar3 == 0;
    if (!bVar5) {
      sVar4 = 0;
      local_48 = sVar3;
      do {
        this_00 = childNode(this,sVar4);
        other_00 = childNode(other,sVar4);
        if ((this_00 != (SyntaxNode *)0x0) == (other_00 == (SyntaxNode *)0x0)) {
          return bVar5;
        }
        if (this_00 == (SyntaxNode *)0x0) {
          local_58 = childToken(this,sVar4);
          local_40 = childToken(other,sVar4);
          if ((local_40.info != (Info *)0x0) != (local_58.info != (Info *)0x0)) {
            return bVar5;
          }
          sVar3 = local_48;
          if (local_58.info != (Info *)0x0) {
            if (local_58.kind != local_40.kind) {
              return bVar5;
            }
            sVar6 = parsing::Token::valueText(&local_58);
            __n = sVar6._M_len;
            sVar7 = parsing::Token::valueText(&local_40);
            if (__n != sVar7._M_len) {
              return bVar5;
            }
            sVar3 = local_48;
            if ((__n != 0) &&
               (iVar2 = bcmp(sVar6._M_str,sVar7._M_str,__n), sVar3 = local_48, iVar2 != 0)) {
              return bVar5;
            }
          }
        }
        else {
          bVar1 = isEquivalentTo(this_00,other_00);
          if (!bVar1) {
            return bVar5;
          }
        }
        sVar4 = sVar4 + 1;
        bVar5 = sVar3 <= sVar4;
      } while (sVar4 != sVar3);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool SyntaxNode::isEquivalentTo(const SyntaxNode& other) const {
    size_t childCount = getChildCount();
    if (kind != other.kind || childCount != other.getChildCount())
        return false;

    for (size_t i = 0; i < childCount; i++) {
        auto ln = childNode(i);
        auto rn = other.childNode(i);
        if (bool(ln) != bool(rn))
            return false;

        if (ln) {
            if (!ln->isEquivalentTo(*rn))
                return false;
        }
        else {
            Token lt = childToken(i);
            Token rt = other.childToken(i);
            if (bool(lt) != bool(rt))
                return false;

            if (lt) {
                if (lt.kind != rt.kind || lt.valueText() != rt.valueText())
                    return false;
            }
        }
    }
    return true;
}